

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodelserialiser.cpp
# Opt level: O0

bool __thiscall
XmlModelSerialiserPrivate::writeXml(XmlModelSerialiserPrivate *this,QXmlStreamWriter *writer)

{
  QAbstractItemModel *pQVar1;
  QXmlStreamWriter *pQVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  int *piVar6;
  const_iterator o;
  QString local_510;
  QArrayDataPointer<char16_t> local_4f8;
  QString local_4e0;
  QString local_4c8;
  QArrayDataPointer<char16_t> local_4b0;
  QString local_498;
  QString local_480;
  QArrayDataPointer<char16_t> local_468;
  QString local_450;
  QArrayDataPointer<char16_t> local_438;
  QString local_420;
  undefined1 local_408 [8];
  QString roleString_1;
  QVariant roleData_1;
  const_iterator local_3c8;
  const_iterator singleRole_1;
  int local_3a4;
  undefined1 local_3a0 [4];
  int i_1;
  QString local_388;
  QString local_370;
  QArrayDataPointer<char16_t> local_358;
  QString local_340;
  QString local_328;
  QArrayDataPointer<char16_t> local_310;
  QString local_2f8;
  QString local_2e0;
  QArrayDataPointer<char16_t> local_2c8;
  QString local_2b0;
  QArrayDataPointer<char16_t> local_298;
  QString local_280;
  undefined1 local_268 [8];
  QString roleString;
  undefined1 local_248 [8];
  QVariant roleData;
  const_iterator local_220;
  const_iterator singleRole;
  int local_1fc;
  undefined1 local_1f8 [4];
  int i;
  QString local_1e0;
  QArrayDataPointer<char16_t> local_1c8;
  QString local_1b0;
  QModelIndex local_198;
  QArrayDataPointer<char16_t> local_170;
  QString local_158;
  QXmlStreamWriter *local_140;
  QXmlStreamWriter *writer_local;
  XmlModelSerialiserPrivate *this_local;
  char16_t *local_128;
  char16_t *str_9;
  QArrayDataPointer<char16_t> *local_118;
  char16_t *local_110;
  char16_t *str_4;
  QArrayDataPointer<char16_t> *local_100;
  char16_t *local_f8;
  char16_t *str_7;
  QArrayDataPointer<char16_t> *local_e8;
  char16_t *local_e0;
  char16_t *str_11;
  QArrayDataPointer<char16_t> *local_d0;
  char16_t *local_c8;
  char16_t *str_10;
  QArrayDataPointer<char16_t> *local_b8;
  char16_t *local_b0;
  char16_t *str_6;
  QArrayDataPointer<char16_t> *local_a0;
  char16_t *local_98;
  char16_t *str_5;
  QArrayDataPointer<char16_t> *local_88;
  char16_t *local_80;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_70;
  char16_t *local_68;
  char16_t *str_2;
  QArrayDataPointer<char16_t> *local_58;
  char16_t *local_50;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_40;
  char16_t *local_38;
  char16_t *str_8;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str_3;
  QArrayDataPointer<char16_t> *local_10;
  
  if ((this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
      m_constModel == (QAbstractItemModel *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_140 = writer;
    writer_local = (QXmlStreamWriter *)this;
    if ((this->m_printStartDocument & 1U) != 0) {
      QXmlStreamWriter::writeStartDocument();
    }
    pQVar2 = local_140;
    str = L"ItemModel";
    local_80 = L"ItemModel";
    local_70 = &local_170;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_170,(Data *)0x0,L"ItemModel",9);
    QString::QString(&local_158,&local_170);
    QXmlStreamWriter::writeStartElement((QString *)pQVar2);
    QString::~QString(&local_158);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_170);
    pQVar2 = local_140;
    QModelIndex::QModelIndex(&local_198);
    writeXmlElement(this,pQVar2,&local_198);
    pQVar2 = local_140;
    str_1 = L"HeaderData";
    local_50 = L"HeaderData";
    local_40 = &local_1c8;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_1c8,(Data *)0x0,L"HeaderData",10);
    QString::QString(&local_1b0,&local_1c8);
    QXmlStreamWriter::writeStartElement((QString *)pQVar2);
    QString::~QString(&local_1b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
    pQVar2 = local_140;
    str_2 = L"Horizontal";
    local_68 = L"Horizontal";
    local_58 = (QArrayDataPointer<char16_t> *)local_1f8;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)local_1f8,(Data *)0x0,L"Horizontal",10);
    QString::QString(&local_1e0,(QArrayDataPointer<char16_t> *)local_1f8);
    QXmlStreamWriter::writeStartElement((QString *)pQVar2);
    QString::~QString(&local_1e0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1f8);
    local_1fc = 0;
    while( true ) {
      pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_constModel;
      QModelIndex::QModelIndex((QModelIndex *)&singleRole);
      iVar5 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,&singleRole);
      if (iVar5 <= local_1fc) break;
      local_220 = QList<int>::constBegin
                            (&(this->super_AbstractStringSerialiserPrivate).
                              super_AbstractModelSerialiserPrivate.m_rolesToSave);
      while( true ) {
        roleData.d._24_8_ =
             QList<int>::constEnd
                       (&(this->super_AbstractStringSerialiserPrivate).
                         super_AbstractModelSerialiserPrivate.m_rolesToSave);
        bVar3 = QList<int>::const_iterator::operator!=(&local_220,(const_iterator)roleData.d._24_8_)
        ;
        if (!bVar3) break;
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        piVar6 = QList<int>::const_iterator::operator*(&local_220);
        (**(code **)(*(long *)pQVar1 + 0xa0))(local_248,pQVar1,local_1fc,1,*piVar6);
        bVar4 = ::QVariant::isNull();
        if ((bVar4 & 1) == 0) {
          AbstractStringSerialiserPrivate::saveVariant
                    ((QString *)local_268,&this->super_AbstractStringSerialiserPrivate,
                     (QVariant *)local_248);
          bVar3 = QString::isEmpty((QString *)local_268);
          pQVar2 = local_140;
          if (bVar3) {
            roleString.d.size._4_4_ = 7;
          }
          else {
            local_10 = &local_298;
            str_3 = L"HeaderDataPoint";
            local_20 = L"HeaderDataPoint";
            QArrayDataPointer<char16_t>::QArrayDataPointer
                      (&local_298,(Data *)0x0,L"HeaderDataPoint",0xf);
            QString::QString(&local_280,&local_298);
            QXmlStreamWriter::writeStartElement((QString *)pQVar2);
            QString::~QString(&local_280);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_298);
            pQVar2 = local_140;
            local_100 = &local_2c8;
            str_4 = L"Section";
            local_110 = L"Section";
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_2c8,(Data *)0x0,L"Section",7);
            QString::QString(&local_2b0,&local_2c8);
            QString::number((int)&local_2e0,local_1fc);
            QXmlStreamWriter::writeAttribute((QString *)pQVar2,(QString *)&local_2b0);
            QString::~QString(&local_2e0);
            QString::~QString(&local_2b0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2c8);
            pQVar2 = local_140;
            local_88 = &local_310;
            str_5 = L"Role";
            local_98 = L"Role";
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_310,(Data *)0x0,L"Role",4);
            QString::QString(&local_2f8,&local_310);
            piVar6 = QList<int>::const_iterator::operator*(&local_220);
            QString::number((int)&local_328,*piVar6);
            QXmlStreamWriter::writeAttribute((QString *)pQVar2,(QString *)&local_2f8);
            QString::~QString(&local_328);
            QString::~QString(&local_2f8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_310);
            pQVar2 = local_140;
            local_a0 = &local_358;
            str_6 = L"Type";
            local_b0 = L"Type";
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_358,(Data *)0x0,L"Type",4);
            QString::QString(&local_340,&local_358);
            iVar5 = ::QVariant::userType((QVariant *)local_248);
            QString::number((int)&local_370,iVar5);
            QXmlStreamWriter::writeAttribute((QString *)pQVar2,(QString *)&local_340);
            QString::~QString(&local_370);
            QString::~QString(&local_340);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_358);
            QXmlStreamWriter::writeCharacters((QString *)local_140);
            QXmlStreamWriter::writeEndElement();
            roleString.d.size._4_4_ = 0;
          }
          QString::~QString((QString *)local_268);
        }
        else {
          roleString.d.size._4_4_ = 7;
        }
        ::QVariant::~QVariant((QVariant *)local_248);
        QList<int>::const_iterator::operator++(&local_220);
      }
      local_1fc = local_1fc + 1;
    }
    QXmlStreamWriter::writeEndElement();
    pQVar2 = local_140;
    str_7 = L"Vertical";
    local_f8 = L"Vertical";
    local_e8 = (QArrayDataPointer<char16_t> *)local_3a0;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)local_3a0,(Data *)0x0,L"Vertical",8);
    QString::QString(&local_388,(QArrayDataPointer<char16_t> *)local_3a0);
    QXmlStreamWriter::writeStartElement((QString *)pQVar2);
    QString::~QString(&local_388);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_3a0);
    local_3a4 = 0;
    while( true ) {
      pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
               m_constModel;
      QModelIndex::QModelIndex((QModelIndex *)&singleRole_1);
      iVar5 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&singleRole_1);
      if (iVar5 <= local_3a4) break;
      local_3c8 = QList<int>::constBegin
                            (&(this->super_AbstractStringSerialiserPrivate).
                              super_AbstractModelSerialiserPrivate.m_rolesToSave);
      while( true ) {
        o = QList<int>::constEnd
                      (&(this->super_AbstractStringSerialiserPrivate).
                        super_AbstractModelSerialiserPrivate.m_rolesToSave);
        bVar3 = QList<int>::const_iterator::operator!=(&local_3c8,o);
        if (!bVar3) break;
        pQVar1 = (this->super_AbstractStringSerialiserPrivate).super_AbstractModelSerialiserPrivate.
                 m_constModel;
        piVar6 = QList<int>::const_iterator::operator*(&local_3c8);
        (**(code **)(*(long *)pQVar1 + 0xa0))(&roleString_1.d.size,pQVar1,local_3a4,2,*piVar6);
        bVar4 = ::QVariant::isNull();
        if ((bVar4 & 1) == 0) {
          AbstractStringSerialiserPrivate::saveVariant
                    ((QString *)local_408,&this->super_AbstractStringSerialiserPrivate,
                     (QVariant *)&roleString_1.d.size);
          bVar3 = QString::isEmpty((QString *)local_408);
          pQVar2 = local_140;
          if (bVar3) {
            roleString.d.size._4_4_ = 0xd;
          }
          else {
            local_28 = &local_438;
            str_8 = L"HeaderDataPoint";
            local_38 = L"HeaderDataPoint";
            QArrayDataPointer<char16_t>::QArrayDataPointer
                      (&local_438,(Data *)0x0,L"HeaderDataPoint",0xf);
            QString::QString(&local_420,&local_438);
            QXmlStreamWriter::writeStartElement((QString *)pQVar2);
            QString::~QString(&local_420);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_438);
            pQVar2 = local_140;
            local_118 = &local_468;
            str_9 = L"Section";
            local_128 = L"Section";
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_468,(Data *)0x0,L"Section",7);
            QString::QString(&local_450,&local_468);
            QString::number((int)&local_480,local_3a4);
            QXmlStreamWriter::writeAttribute((QString *)pQVar2,(QString *)&local_450);
            QString::~QString(&local_480);
            QString::~QString(&local_450);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_468);
            pQVar2 = local_140;
            local_b8 = &local_4b0;
            str_10 = L"Role";
            local_c8 = L"Role";
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_4b0,(Data *)0x0,L"Role",4);
            QString::QString(&local_498,&local_4b0);
            piVar6 = QList<int>::const_iterator::operator*(&local_3c8);
            QString::number((int)&local_4c8,*piVar6);
            QXmlStreamWriter::writeAttribute((QString *)pQVar2,(QString *)&local_498);
            QString::~QString(&local_4c8);
            QString::~QString(&local_498);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4b0);
            pQVar2 = local_140;
            local_d0 = &local_4f8;
            str_11 = L"Type";
            local_e0 = L"Type";
            QArrayDataPointer<char16_t>::QArrayDataPointer(&local_4f8,(Data *)0x0,L"Type",4);
            QString::QString(&local_4e0,&local_4f8);
            iVar5 = ::QVariant::userType((QVariant *)&roleString_1.d.size);
            QString::number((int)&local_510,iVar5);
            QXmlStreamWriter::writeAttribute((QString *)pQVar2,(QString *)&local_4e0);
            QString::~QString(&local_510);
            QString::~QString(&local_4e0);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4f8);
            QXmlStreamWriter::writeCharacters((QString *)local_140);
            QXmlStreamWriter::writeEndElement();
            roleString.d.size._4_4_ = 0;
          }
          QString::~QString((QString *)local_408);
        }
        else {
          roleString.d.size._4_4_ = 0xd;
        }
        ::QVariant::~QVariant((QVariant *)&roleString_1.d.size);
        QList<int>::const_iterator::operator++(&local_3c8);
      }
      local_3a4 = local_3a4 + 1;
    }
    QXmlStreamWriter::writeEndElement();
    QXmlStreamWriter::writeEndElement();
    QXmlStreamWriter::writeEndElement();
    if ((this->m_printStartDocument & 1U) != 0) {
      QXmlStreamWriter::writeEndDocument();
    }
    bVar4 = QXmlStreamWriter::hasError();
    this_local._7_1_ = (bool)((bVar4 ^ 0xff) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool XmlModelSerialiserPrivate::writeXml(QXmlStreamWriter &writer) const
{
    if (!m_constModel)
        return false;
    if (m_printStartDocument)
        writer.writeStartDocument();
    writer.writeStartElement(QStringLiteral("ItemModel"));
    writeXmlElement(writer);
    writer.writeStartElement(QStringLiteral("HeaderData"));
    writer.writeStartElement(QStringLiteral("Horizontal"));
    for (int i = 0; i < m_constModel->columnCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Horizontal, *singleRole);
            if (roleData.isNull())
                continue;
            const QString roleString = saveVariant(roleData);
            if (roleString.isEmpty())
                continue; // Skip unhandled types
            writer.writeStartElement(QStringLiteral("HeaderDataPoint"));
            writer.writeAttribute(QStringLiteral("Section"), QString::number(i));
            writer.writeAttribute(QStringLiteral("Role"), QString::number(*singleRole));
            writer.writeAttribute(QStringLiteral("Type"), QString::number(roleData.userType()));
            writer.writeCharacters(roleString);
            writer.writeEndElement(); // HeaderDataPoint
        }
    }
    writer.writeEndElement(); // Horizontal
    writer.writeStartElement(QStringLiteral("Vertical"));
    for (int i = 0; i < m_constModel->rowCount(); ++i) {
        for (QList<int>::const_iterator singleRole = m_rolesToSave.constBegin(); singleRole != m_rolesToSave.constEnd(); ++singleRole) {
            const QVariant roleData = m_constModel->headerData(i, Qt::Vertical, *singleRole);
            if (roleData.isNull())
                continue;
            const QString roleString = saveVariant(roleData);
            if (roleString.isEmpty())
                continue; // Skip unhandled types
            writer.writeStartElement(QStringLiteral("HeaderDataPoint"));
            writer.writeAttribute(QStringLiteral("Section"), QString::number(i));
            writer.writeAttribute(QStringLiteral("Role"), QString::number(*singleRole));
            writer.writeAttribute(QStringLiteral("Type"), QString::number(roleData.userType()));
            writer.writeCharacters(roleString);
            writer.writeEndElement(); // HeaderDataPoint
        }
    }
    writer.writeEndElement(); // Vertical
    writer.writeEndElement(); // HeaderData
    writer.writeEndElement(); // ItemModel
    if (m_printStartDocument)
        writer.writeEndDocument();
    return !writer.hasError();
}